

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

string * __thiscall
spvtools::opt::analysis::Float::str_abi_cxx11_(string *__return_storage_ptr__,Float *this)

{
  ostream *this_00;
  ostringstream local_190 [8];
  ostringstream oss;
  Float *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  this_00 = std::operator<<((ostream *)local_190,"float");
  std::ostream::operator<<(this_00,*(uint *)&(this->super_Type).field_0x24);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string Float::str() const {
  std::ostringstream oss;
  oss << "float" << width_;
  return oss.str();
}